

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_common.c
# Opt level: O2

LY_ERR lysp_check_dup_identities(lysp_ctx *ctx,lysp_module *mod)

{
  LY_ERR LVar1;
  ly_ht *ht;
  ulong uVar2;
  lysp_ident *plVar3;
  lysp_include *plVar4;
  ulong uVar5;
  lysp_ident *plVar6;
  lysp_ident *plVar7;
  
  LVar1 = LY_EMEM;
  ht = lyht_new(8,8,ly_ptrequal_cb,(void *)0x0,1);
  if (ht != (ly_ht *)0x0) {
    plVar3 = mod->identities;
    plVar6 = plVar3;
    for (plVar7 = plVar3;
        (plVar3 != (lysp_ident *)0x0 &&
        ((ulong)((long)plVar7 - (long)plVar3) / 0x38 < *(ulong *)&plVar3[-1].flags));
        plVar7 = plVar7 + 1) {
      LVar1 = lysp_check_dup_ht_insert
                        (ctx,ht,plVar6->name,"identity",
                         "name collision with another top-level identity");
      if (LVar1 != LY_SUCCESS) goto LAB_0015c864;
      plVar6 = plVar6 + 1;
      plVar3 = mod->identities;
    }
    plVar4 = mod->includes;
    uVar5 = 0;
    while( true ) {
      if (plVar4 == (lysp_include *)0x0) {
        uVar2 = 0;
      }
      else {
        uVar2 = *(ulong *)(plVar4[-1].rev + 8);
      }
      if (uVar2 <= uVar5) break;
      plVar3 = (plVar4[uVar5].submodule)->identities;
      plVar6 = plVar3;
      while( true ) {
        plVar4 = mod->includes;
        plVar7 = (plVar4[uVar5].submodule)->identities;
        if ((plVar7 == (lysp_ident *)0x0) ||
           (*(ulong *)&plVar7[-1].flags <= (ulong)((long)plVar6 - (long)plVar7) / 0x38)) break;
        LVar1 = lysp_check_dup_ht_insert
                          (ctx,ht,plVar3->name,"identity",
                           "name collision with another top-level identity");
        plVar3 = plVar3 + 1;
        plVar6 = plVar6 + 1;
        if (LVar1 != LY_SUCCESS) goto LAB_0015c864;
      }
      uVar5 = uVar5 + 1;
    }
    LVar1 = LY_SUCCESS;
LAB_0015c864:
    lyht_free(ht,(_func_void_void_ptr *)0x0);
  }
  return LVar1;
}

Assistant:

LY_ERR
lysp_check_dup_identities(struct lysp_ctx *ctx, struct lysp_module *mod)
{
    LY_ARRAY_COUNT_TYPE u;
    struct ly_ht *ht;
    struct lysp_ident *i;
    LY_ERR ret = LY_SUCCESS;

    ht = lyht_new(LYHT_MIN_SIZE, sizeof(void *), ly_ptrequal_cb, NULL, 1);
    LY_CHECK_RET(!ht, LY_EMEM);

    /* add all module identities into a hash table */
    LY_ARRAY_FOR(mod->identities, struct lysp_ident, i) {
        ret = lysp_check_dup_ht_insert(ctx, ht, i->name, "identity",
                "name collision with another top-level identity");
        LY_CHECK_GOTO(ret, cleanup);
    }

    /* add all submodule identities into a hash table */
    LY_ARRAY_FOR(mod->includes, u) {
        LY_ARRAY_FOR(mod->includes[u].submodule->identities, struct lysp_ident, i) {
            ret = lysp_check_dup_ht_insert(ctx, ht, i->name, "identity",
                    "name collision with another top-level identity");
            LY_CHECK_GOTO(ret, cleanup);
        }
    }

cleanup:
    lyht_free(ht, NULL);
    return ret;
}